

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blech32.c
# Opt level: O2

int wally_confidential_addr_from_addr_segwit
              (char *address,char *addr_family,char *confidential_addr_family,uchar *pub_key,
              size_t pub_key_len,char **output)

{
  size_t sVar1;
  byte bVar2;
  size_t sVar3;
  uint64_t uVar4;
  char *pcVar5;
  int iVar6;
  ulong uVar7;
  byte *pbVar8;
  long lVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  size_t local_878;
  size_t local_870;
  uchar buf [65];
  byte bStack_819;
  uint8_t data [1000];
  char result [1001];
  
  local_878 = 0x22;
  if (output != (char **)0x0) {
    *output = (char *)0x0;
  }
  auVar11._0_4_ = -(uint)(address == (char *)0x0);
  auVar11._4_4_ = -(uint)(addr_family == (char *)0x0);
  auVar11._8_4_ = -(uint)(confidential_addr_family == (char *)0x0);
  auVar11._12_4_ = -(uint)(pub_key == (uchar *)0x0);
  iVar6 = movmskps((int)confidential_addr_family,auVar11);
  if ((pub_key_len != 0x21 || output == (char **)0x0) || iVar6 != 0) {
    return -2;
  }
  sVar3 = strlen(confidential_addr_family);
  if (999 < sVar3) {
    return -2;
  }
  iVar6 = wally_addr_segwit_to_bytes(address,addr_family,0,buf + 0x1f,0x22,&local_878);
  if (iVar6 == 0) {
    if ((local_878 == 0x22) || (local_878 == 0x16)) {
      buf[0x20] = pub_key[0x20];
      buf._0_8_ = *(undefined8 *)pub_key;
      buf._8_8_ = *(undefined8 *)(pub_key + 8);
      buf._16_8_ = *(undefined8 *)(pub_key + 0x10);
      buf._24_8_ = *(undefined8 *)(pub_key + 0x18);
      sVar1 = local_878 + 0x1f;
      local_870 = 0;
      if ((local_878 == 0x22) || (local_878 == 0x16)) {
        data[0] = '\0';
        local_878 = sVar1;
        blech32_convert_bits(data + 1,&local_870,5,buf,sVar1,8,1);
        sVar1 = local_870;
        uVar7 = local_870 + 0xe;
        uVar4 = 1;
        for (pbVar8 = (byte *)confidential_addr_family; bVar2 = *pbVar8, bVar2 != 0;
            pbVar8 = pbVar8 + 1) {
          if ((byte)(bVar2 + 0x81) < 0xa2) {
            return -1;
          }
          if ((byte)(bVar2 + 0xbf) < 0x1a) {
            return -1;
          }
          uVar4 = blech32_polymod_step(uVar4);
          uVar4 = bVar2 >> 5 ^ uVar4;
          uVar7 = uVar7 + 1;
        }
        if (uVar7 < 0x3e9) {
          uVar4 = blech32_polymod_step(uVar4);
          pbVar8 = (byte *)result;
          for (; bVar2 = *confidential_addr_family, bVar2 != 0;
              confidential_addr_family = (char *)((byte *)confidential_addr_family + 1)) {
            uVar4 = blech32_polymod_step(uVar4);
            uVar4 = bVar2 & 0x1f ^ uVar4;
            *pbVar8 = bVar2;
            pbVar8 = pbVar8 + 1;
          }
          *pbVar8 = 0x31;
          for (lVar9 = 1; lVar9 - sVar1 != 2; lVar9 = lVar9 + 1) {
            uVar7 = (ulong)data[lVar9 + -1];
            if (0x1f < uVar7) {
              return -1;
            }
            uVar4 = blech32_polymod_step(uVar4);
            uVar4 = uVar4 ^ uVar7;
            pbVar8[lVar9] = "qpzry9x8gf2tvdw0s3jn54khce6mua7l"[uVar7];
          }
          pbVar8 = pbVar8 + lVar9;
          lVar9 = 0xc;
          while (bVar10 = lVar9 != 0, lVar9 = lVar9 + -1, bVar10) {
            uVar4 = blech32_polymod_step(uVar4);
          }
          for (lVar9 = 0x37; lVar9 != -5; lVar9 = lVar9 + -5) {
            *pbVar8 = "qpzry9x8gf2tvdw0s3jn54khce6mua7l"
                      [(uint)((uVar4 ^ 1) >> ((byte)lVar9 & 0x3f)) & 0x1f];
            pbVar8 = pbVar8 + 1;
          }
          *pbVar8 = 0;
          pcVar5 = wally_strdup(result);
          *output = pcVar5;
          iVar6 = (uint)(pcVar5 != (char *)0x0) * 3 + -3;
          goto LAB_003f1d7c;
        }
      }
      else {
        local_878 = sVar1;
        wally_clear_2(data,1000,buf,sVar1);
      }
      return -1;
    }
    iVar6 = -2;
  }
LAB_003f1d7c:
  wally_clear(buf,0x41);
  wally_clear(result,0x3e9);
  return iVar6;
}

Assistant:

int wally_confidential_addr_from_addr_segwit(
    const char *address,
    const char *addr_family,
    const char *confidential_addr_family,
    const unsigned char *pub_key,
    size_t pub_key_len,
    char **output)
{
    char result[WALLY_BLECH32_MAXLEN + 1];
    unsigned char buf[EC_PUBLIC_KEY_LEN + SHA256_LEN];
    unsigned char *hash_bytes_p = &buf[EC_PUBLIC_KEY_LEN - 2];
    size_t written = SHA256_LEN + 2;
    int ret;

    if (output)
        *output = NULL;

    if (!address || !addr_family || !confidential_addr_family || !pub_key ||
        pub_key_len != EC_PUBLIC_KEY_LEN || !output ||
        strlen(confidential_addr_family) >= WALLY_BLECH32_MAXLEN)
        return WALLY_EINVAL;

    /* get v0 witness programs script */
    ret = wally_addr_segwit_to_bytes(address, addr_family, 0,
                                     hash_bytes_p, written, &written);
    if (ret == WALLY_OK) {
        if ((written != (HASH160_LEN + 2)) && (written != (SHA256_LEN + 2)))
            ret = WALLY_EINVAL;
        else {
            /* Copy the confidentialKey / v0 witness programs */
            memcpy(buf, pub_key, pub_key_len);
            written -= 2;   /* ignore witnessVersion & hashSize */
            written += EC_PUBLIC_KEY_LEN;
            if (!blech32_addr_encode(result, confidential_addr_family, 0, buf, written))
                return WALLY_ERROR;

            *output = wally_strdup(result);
            ret = (*output) ? WALLY_OK : WALLY_ENOMEM;
        }
    }

    wally_clear(buf, sizeof(buf));
    wally_clear(result, sizeof(result));
    return ret;
}